

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::UserDefinedNetDeclarationSyntax::UserDefinedNetDeclarationSyntax
          (UserDefinedNetDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token netType,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  bool bVar1;
  TimingControlSyntax *pTVar2;
  DeclaratorSyntax *pDVar3;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RDI;
  TimingControlSyntax *in_R8;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffb0 [16];
  MemberSyntax *in_stack_ffffffffffffffc0;
  TimingControlSyntax *local_38 [2];
  TimingControlSyntax *local_28;
  SyntaxNode *local_10;
  size_t local_8;
  
  rhs = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)&stack0x00000008;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0._12_4_,
             in_stack_ffffffffffffffb0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_10;
  in_RDI[1].super_SyntaxListBase.childCount = local_8;
  local_38[0] = local_28;
  not_null<slang::syntax::TimingControlSyntax_*>::not_null<slang::syntax::TimingControlSyntax_*>
            ((not_null<slang::syntax::TimingControlSyntax_*> *)&in_RDI[1].elements,local_38);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_extent._M_extent_value =
       (size_t)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[3].super_SyntaxListBase._vptr_SyntaxListBase =
       *(_func_int ***)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  pTVar2 = not_null<slang::syntax::TimingControlSyntax_*>::operator->
                     ((not_null<slang::syntax::TimingControlSyntax_*> *)0x76b7f0);
  (pTVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
  *(SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> **)
   &in_RDI[2].super_SyntaxListBase.super_SyntaxNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x76b813);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_RDI,(iterator_base<slang::syntax::DeclaratorSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x76b852);
    (pDVar3->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

UserDefinedNetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, TimingControlSyntax& delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::UserDefinedNetDeclaration, attributes), netType(netType), delay(&delay), declarators(declarators), semi(semi) {
        this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }